

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

bool __thiscall
json::LoadObject::process<std::vector<obj_array_var1*,std::allocator<obj_array_var1*>>>
          (LoadObject *this,char *name,
          vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *value)

{
  int iVar1;
  char *pcVar2;
  vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> local_48;
  char *end;
  vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *value_local;
  char *name_local;
  LoadObject *this_local;
  
  end = (char *)value;
  value_local = (vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *)name;
  name_local = (char *)this;
  iVar1 = strcmp(this->_prev_name,name);
  if (-1 < iVar1) {
    __assert_fail("false && \"variables should be serialized in alphabetical order\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/yak32[P]glw_json/tests/../glw_json.h"
                  ,0x10c,
                  "bool json::LoadObject::process(const char *, V &) [V = std::vector<obj_array_var1 *>]"
                 );
  }
  this->_prev_name = (char *)value_local;
  if ((this->current < this->props_size) &&
     (iVar1 = strncmp((char *)value_local,(*this->props)[this->current].param.str,
                      (*this->props)[this->current].param.len), iVar1 == 0)) {
    pcVar2 = load<obj_array_var1*,std::allocator<obj_array_var1*>>
                       ((*this->props)[this->current].value.str,
                        (*this->props)[this->current].value.len,
                        (vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *)end,
                        this->options);
    if (pcVar2 == (*this->props)[this->current].value.str + (*this->props)[this->current].value.len)
    {
      this->current = this->current + 1;
      return true;
    }
    this->error_pos = pcVar2;
  }
  else if ((this->options & 2U) == 0) {
    if ((this->options & 1U) != 0) {
      memset(&local_48,0,0x18);
      std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>::vector(&local_48);
      std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>::operator=
                ((vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_> *)end,&local_48);
      std::vector<obj_array_var1_*,_std::allocator<obj_array_var1_*>_>::~vector(&local_48);
    }
    return true;
  }
  this->current = this->props_size;
  return false;
}

Assistant:

bool process(const char* name, V& value) {
#ifndef NDEBUG
		// this check could fail if name is dynamically allocated and was freed after usage
		// if Sublime Text 3 is used, select everything inside serialize() and press F9
		if (strcmp(_prev_name, name) >= 0)
			assert(false && "variables should be serialized in alphabetical order");
		_prev_name = name;
#endif
		if (current < props_size &&
			strncmp(name, props[current].param.str, props[current].param.len) == 0) {
			const char* end =
				load(props[current].value.str, props[current].value.len, value, options);
			if (end == props[current].value.str + props[current].value.len) {
				++current;
				return true;
			}
			error_pos = end;
		}
		else if (!(options & ERROR_IF_ABSENT)) {
			if (options & RESET_IF_ABSENT)
				value = V();
			return true;
		}
		current = props_size; // skip parsing
		return false;
	}